

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.cpp
# Opt level: O1

uint8_t VBitmap::Impl::depth(Format format)

{
  uint8_t uVar1;
  
  uVar1 = '\x01';
  if (format < 4) {
    uVar1 = (uint8_t)(0x20200801 >> (format * '\b' & 0x1f));
  }
  return uVar1;
}

Assistant:

uint8_t VBitmap::Impl::depth(VBitmap::Format format)
{
    uint8_t depth = 1;
    switch (format) {
    case VBitmap::Format::Alpha8:
        depth = 8;
        break;
    case VBitmap::Format::ARGB32:
    case VBitmap::Format::ARGB32_Premultiplied:
        depth = 32;
        break;
    default:
        break;
    }
    return depth;
}